

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::zeroPointerAndFars(SegmentBuilder *segment,WirePointer *ref)

{
  bool bVar1;
  Kind KVar2;
  Id<unsigned_int,_capnp::_::Segment> id;
  BuilderArena *this;
  SegmentBuilder *this_00;
  WirePointer *ptr;
  WirePointer *pad;
  SegmentBuilder *padSegment;
  WirePointer *ref_local;
  SegmentBuilder *segment_local;
  
  KVar2 = WirePointer::kind(ref);
  if (KVar2 == FAR) {
    this = SegmentBuilder::getArena(segment);
    id = DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                   ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                    &(ref->field_1).structRef);
    this_00 = BuilderArena::getSegment(this,(SegmentId)id.value);
    bVar1 = SegmentBuilder::isWritable(this_00);
    if (bVar1) {
      ptr = (WirePointer *)WirePointer::farTarget(ref,this_00);
      bVar1 = WirePointer::isDoubleFar(ref);
      if (bVar1) {
        zeroMemory(ptr,2);
      }
      else {
        zeroMemory(ptr);
      }
    }
  }
  zeroMemory(ref);
  return;
}

Assistant:

static KJ_ALWAYS_INLINE(
      void zeroPointerAndFars(SegmentBuilder* segment, WirePointer* ref)) {
    // Zero out the pointer itself and, if it is a far pointer, zero the landing pad as well, but
    // do not zero the object body.  Used when upgrading.

    if (ref->kind() == WirePointer::FAR) {
      SegmentBuilder* padSegment = segment->getArena()->getSegment(ref->farRef.segmentId.get());
      if (padSegment->isWritable()) {  // Don't zero external data.
        WirePointer* pad = reinterpret_cast<WirePointer*>(ref->farTarget(padSegment));
        if (ref->isDoubleFar()) {
          zeroMemory(pad, G(2) * POINTERS);
        } else {
          zeroMemory(pad);
        }
      }
    }

    zeroMemory(ref);
  }